

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O3

void save_keypress_history(keypress *kp)

{
  keypress *pkVar1;
  uint uVar2;
  keycode_t kVar3;
  keypress *__dest;
  int16_t iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  
  if (*borg_cfg != 0) {
    if (kp->type == EVT_KBRD) {
      uVar2 = kp->code;
      uVar7 = (ulong)uVar2;
      if (uVar2 - 0x20 < 0x5f) {
        pcVar5 = format("& Key <%c> (0x%02lX)",uVar7,uVar7);
      }
      else {
        if (uVar7 == 0xe000) {
          pcVar5 = "& Key <Esc> (0x%02lX)";
          uVar7 = 0xe000;
        }
        else if (uVar2 == 0x9c) {
          pcVar5 = "& Key <Enter> (0x%02lX)";
          uVar7 = 0x9c;
        }
        else {
          pcVar5 = "& Key <0x%02lX>";
        }
        pcVar5 = format(pcVar5,uVar7);
      }
    }
    else {
      pcVar5 = format("& non-Keyboard <0x%02X>");
    }
    borg_note_internal(false,pcVar5);
  }
  iVar4 = borg_key_history_head;
  __dest = borg_key_history;
  lVar6 = (long)borg_key_history_head;
  borg_key_history_head = borg_key_history_head + 1;
  kVar3 = kp->code;
  pkVar1 = borg_key_history + lVar6;
  pkVar1->type = kp->type;
  pkVar1->code = kVar3;
  if (iVar4 == 0x1fff) {
    memcpy(__dest,__dest + 0x1f9b,0x4b0);
    borg_key_history_head = 100;
  }
  return;
}

Assistant:

void save_keypress_history(struct keypress *kp)
{
    /* Note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (kp->type == EVT_KBRD) {
            keycode_t k = kp->code;
            if (k >= 32 && k <= 126) {
                borg_note(format("& Key <%c> (0x%02lX)", (char)k, (unsigned long)k));
            } else {
                if (k == KC_ENTER)
                    borg_note(format("& Key <Enter> (0x%02lX)", (unsigned long)k));
                else if (k == ESCAPE)
                    borg_note(format("& Key <Esc> (0x%02lX)", (unsigned long)k));
                else
                    borg_note(format("& Key <0x%02lX>", (unsigned long)k));
            }
        } else {
            borg_note(format("& non-Keyboard <0x%02X>", kp->type));
        }

    }

    /* Store the char, advance the queue */
    borg_key_history[borg_key_history_head].code = kp->code;
    borg_key_history[borg_key_history_head++].type = kp->type;

    /* on full array, keep the last 100 */
    if (borg_key_history_head == KEY_SIZE) {
        memcpy(borg_key_history, &borg_key_history[KEY_SIZE - 101], sizeof(struct keypress) * 100);
        borg_key_history_head = 100;
    }
}